

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger.cc
# Opt level: O0

void __thiscall
SimpleLogger::findMinMaxRevNumInternal
          (SimpleLogger *this,bool *min_revnum_initialized,size_t *min_revnum,size_t *max_revnum,
          string *f_name)

{
  string *psVar1;
  bool bVar2;
  int iVar3;
  ulong uVar4;
  char *__nptr;
  unsigned_long *puVar5;
  unsigned_long *in_RCX;
  unsigned_long *in_RDX;
  byte *in_RSI;
  string *in_R8;
  size_t revnum;
  string ext;
  bool comp_file;
  size_t last_dot;
  char *in_stack_fffffffffffffed8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffee0;
  unsigned_long local_118;
  unsigned_long local_c0;
  unsigned_long local_b8;
  string local_b0 [36];
  undefined4 local_8c;
  string local_88 [48];
  string local_58 [39];
  byte local_31;
  long local_30;
  string *local_28;
  unsigned_long *local_20;
  unsigned_long *local_18;
  byte *local_10;
  
  local_28 = in_R8;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_30 = std::__cxx11::string::rfind((char *)in_R8,0x5fea9b);
  psVar1 = local_28;
  if (local_30 == -1) {
    return;
  }
  local_31 = 0;
  std::__cxx11::string::size();
  std::__cxx11::string::substr((ulong)local_58,(ulong)psVar1);
  bVar2 = std::operator==(in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
  if ((bVar2) && (uVar4 = std::__cxx11::string::size(), psVar1 = local_28, 7 < uVar4)) {
    std::__cxx11::string::size();
    std::__cxx11::string::substr((ulong)local_88,(ulong)psVar1);
    std::__cxx11::string::operator=(local_28,local_88);
    std::__cxx11::string::~string(local_88);
    local_30 = std::__cxx11::string::rfind((char *)local_28,0x5fea9b);
    if (local_30 == -1) {
      local_8c = 1;
      goto LAB_002216fd;
    }
    std::__cxx11::string::size();
    std::__cxx11::string::substr((ulong)local_b0,(ulong)local_28);
    std::__cxx11::string::operator=(local_58,local_b0);
    std::__cxx11::string::~string(local_b0);
    local_31 = 1;
  }
  __nptr = (char *)std::__cxx11::string::c_str();
  iVar3 = atoi(__nptr);
  local_b8 = (unsigned_long)iVar3;
  local_118 = local_b8;
  if ((local_31 & 1) != 0) {
    local_118 = local_b8 + 1;
  }
  local_c0 = local_118;
  puVar5 = std::max<unsigned_long>(local_20,&local_c0);
  *local_20 = *puVar5;
  if ((*local_10 & 1) == 0) {
    *local_18 = local_b8;
    *local_10 = 1;
  }
  puVar5 = std::min<unsigned_long>(local_18,&local_b8);
  *local_18 = *puVar5;
  local_8c = 0;
LAB_002216fd:
  std::__cxx11::string::~string(local_58);
  return;
}

Assistant:

void SimpleLogger::findMinMaxRevNumInternal(bool& min_revnum_initialized,
                                            size_t& min_revnum,
                                            size_t& max_revnum,
                                            std::string& f_name)
{
    size_t last_dot = f_name.rfind(".");
    if (last_dot == std::string::npos) return;

    bool comp_file = false;
    std::string ext = f_name.substr(last_dot + 1, f_name.size() - last_dot - 1);
    if (ext == "gz" && f_name.size() > 7) {
        // Compressed file: asdf.log.123.tar.gz => need to get 123.
        f_name = f_name.substr(0, f_name.size() - 7);
        last_dot = f_name.rfind(".");
        if (last_dot == std::string::npos) return;
        ext = f_name.substr(last_dot + 1, f_name.size() - last_dot - 1);
        comp_file = true;
    }

    size_t revnum = atoi(ext.c_str());
    max_revnum = std::max( max_revnum,
                           ( (comp_file) ? (revnum+1) : (revnum) ) );
    if (!min_revnum_initialized) {
        min_revnum = revnum;
        min_revnum_initialized = true;
    }
    min_revnum = std::min(min_revnum, revnum);
}